

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void arm::display_shift(ostream *o,RegisterShiftKind shift)

{
  if (shift < (Rrx|Lsl)) {
    std::operator<<(o,&DAT_0019558c + *(int *)(&DAT_0019558c + (ulong)shift * 4));
    return;
  }
  return;
}

Assistant:

void display_shift(std::ostream &o, RegisterShiftKind shift) {
  switch (shift) {
    case RegisterShiftKind::Lsl:
      o << "LSL";
      break;
    case RegisterShiftKind::Lsr:
      o << "LSR";
      break;
    case RegisterShiftKind::Asr:
      o << "ASR";
      break;
    case RegisterShiftKind::Ror:
      o << "ROR";
      break;
    case RegisterShiftKind::Rrx:
      o << "RRX";
      break;
  }
}